

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::Argument_Binding::MergeFrom
          (Argument_Binding *this,Argument_Binding *from)

{
  void *pvVar1;
  LogMessage *other;
  Value *pVVar2;
  Value *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/MIL.pb.cc"
               ,0x83f);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] == 1) {
    pVVar2 = (from->binding_).value_;
    if (this->_oneof_case_[0] == 1) {
      if ((this->binding_).value_ !=
          (Value *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        std::__cxx11::string::_M_assign((string *)(this->binding_).value_);
        return;
      }
    }
    else {
      clear_binding(this);
      this->_oneof_case_[0] = 1;
      (this->binding_).value_ =
           (Value *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->binding_).name_,(string *)pVVar2);
    return;
  }
  if (from->_oneof_case_[0] != 2) {
    return;
  }
  if (this->_oneof_case_[0] == 2) {
    pVVar2 = (this->binding_).value_;
  }
  else {
    clear_binding(this);
    this->_oneof_case_[0] = 2;
    pVVar2 = (Value *)operator_new(0x30);
    Value::Value(pVVar2);
    (this->binding_).value_ = pVVar2;
    if (from->_oneof_case_[0] != 2) {
      protobuf_MIL_2eproto::InitDefaults();
      from_00 = (Value *)&_Value_default_instance_;
      goto LAB_002ca73c;
    }
  }
  from_00 = (from->binding_).value_;
LAB_002ca73c:
  Value::MergeFrom(pVVar2,from_00);
  return;
}

Assistant:

void Argument_Binding::MergeFrom(const Argument_Binding& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Argument.Binding)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.binding_case()) {
    case kName: {
      set_name(from.name());
      break;
    }
    case kValue: {
      mutable_value()->::CoreML::Specification::MILSpec::Value::MergeFrom(from.value());
      break;
    }
    case BINDING_NOT_SET: {
      break;
    }
  }
}